

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O1

void __thiscall
helics::TimeCoordinator::timeRequest
          (TimeCoordinator *this,Time nextTime,IterationRequest iterate,Time newValueTime,
          Time newMessageTime)

{
  int32_t *piVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  TimeRepresentation<count_time<9,_long>_> *__result;
  Time TVar4;
  long *plVar5;
  long lVar6;
  undefined1 local_48 [16];
  long local_38;
  
  plVar5 = (long *)local_48;
  this->iterating = iterate;
  if (iterate == NO_ITERATIONS) {
    TVar4 = getNextPossibleTime(this);
    if (nextTime.internalTimeCode < TVar4.internalTimeCode) {
      nextTime = TVar4;
    }
    (this->time_next).internalTimeCode = TVar4.internalTimeCode;
    lVar6 = 0x140;
    if ((this->info).uninterruptible == true) {
      TVar4 = generateAllowedTime(this,nextTime);
      (this->time_next).internalTimeCode = TVar4.internalTimeCode;
    }
  }
  else {
    lVar6 = (this->time_granted).internalTimeCode;
    if (nextTime.internalTimeCode < lVar6) {
      nextTime.internalTimeCode = lVar6;
    }
    if (iterate == FORCE_ITERATION) {
      nextTime.internalTimeCode = lVar6;
    }
    lVar6 = 0x130;
  }
  (this->time_requested).internalTimeCode = nextTime.internalTimeCode;
  lVar6 = *(long *)((long)&(this->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator + lVar6);
  if (newValueTime.internalTimeCode < lVar6) {
    newValueTime.internalTimeCode = lVar6;
  }
  if (newMessageTime.internalTimeCode < lVar6) {
    newMessageTime.internalTimeCode = lVar6;
  }
  (this->time_value).internalTimeCode = newValueTime.internalTimeCode;
  (this->time_message).internalTimeCode = newMessageTime.internalTimeCode;
  uVar2 = this->time_message;
  uVar3 = this->time_value;
  local_48._8_4_ = (int)uVar2;
  local_48._0_8_ = uVar3;
  local_48._12_4_ = (int)((ulong)uVar2 >> 0x20);
  local_38 = nextTime.internalTimeCode;
  lVar6 = 8;
  do {
    if (*(long *)(local_48 + lVar6) < *plVar5) {
      plVar5 = (long *)(local_48 + lVar6);
    }
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x18);
  lVar6 = *plVar5;
  (this->time_exec).internalTimeCode = lVar6;
  if (((this->info).uninterruptible == true) &&
     ((iterate == NO_ITERATIONS || ((this->time_granted).internalTimeCode < lVar6)))) {
    (this->time_exec).internalTimeCode = nextTime.internalTimeCode;
  }
  TimeDependencies::resetDependentEvents
            (&(this->super_BaseTimeCoordinator).dependencies,
             (Time)(this->time_granted).internalTimeCode);
  piVar1 = &(this->super_BaseTimeCoordinator).sequenceCounter;
  *piVar1 = *piVar1 + 1;
  (*(this->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[2])(this);
  if ((this->super_BaseTimeCoordinator).dependencies.dependencies.
      super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->super_BaseTimeCoordinator).dependencies.dependencies.
      super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    sendTimeRequest(this,(GlobalFederateId)0x8831d580);
    return;
  }
  return;
}

Assistant:

void TimeCoordinator::timeRequest(Time nextTime,
                                  IterationRequest iterate,
                                  Time newValueTime,
                                  Time newMessageTime)
{
    iterating = iterate;

    if (iterating != IterationRequest::NO_ITERATIONS) {
        if (nextTime < time_granted || iterating == IterationRequest::FORCE_ITERATION) {
            nextTime = time_granted;
        }
    } else {
        time_next = getNextPossibleTime();
        if (nextTime < time_next) {
            nextTime = time_next;
        }
        if (info.uninterruptible) {
            time_next = generateAllowedTime(nextTime);
        }
    }
    time_requested = nextTime;
    if (iterating != IterationRequest::NO_ITERATIONS) {
        time_value = (newValueTime > time_granted) ? newValueTime : time_granted;
        time_message = (newMessageTime > time_granted) ? newMessageTime : time_granted;
    } else {
        time_value = (newValueTime > time_next) ? newValueTime : time_next;
        time_message = (newMessageTime > time_next) ? newMessageTime : time_next;
    }

    time_exec = std::min({time_value, time_message, time_requested});
    if (info.uninterruptible) {
        if (time_exec > time_granted || iterating == IterationRequest::NO_ITERATIONS) {
            time_exec = time_requested;
        }
    }
    dependencies.resetDependentEvents(time_granted);
    ++sequenceCounter;
    updateTimeFactors();

    if (!dependencies.empty()) {
        sendTimeRequest(GlobalFederateId{});
    }
}